

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O1

Expression * __thiscall
soul::StructuralParser::parseArrayTypeSuffixes
          (StructuralParser *this,Expression *t,ParseTypeContext parseContext)

{
  char *pcVar1;
  bool bVar2;
  int iVar3;
  PoolItem *pPVar4;
  CompileMessage local_60;
  
  while (bVar2 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                 ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x2b016a), bVar2)
  {
    t = parseSubscriptWithBrackets(this,t);
  }
  pcVar1 = (this->super_SOULTokeniser).currentType.text;
  if ((pcVar1 == "&") || ((pcVar1 != (char *)0x0 && (iVar3 = strcmp(pcVar1,"&"), iVar3 == 0)))) {
    switch(parseContext) {
    case variableType:
      CompileMessageHelpers::createMessage<>
                (&local_60,syntax,error,"This type cannot be a reference");
      (*(this->super_SOULTokeniser)._vptr_Tokeniser[2])(this,&local_60);
      RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_60.location.sourceCode.object);
      break;
    case nameOrType:
    case metaFunctionArgument:
      goto switchD_001fa30e_caseD_1;
    default:
      Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
      ::skip(&this->super_SOULTokeniser);
      pPVar4 = PoolAllocator::allocateSpaceForObject(&this->allocator->pool,0x40);
      AST::TypeMetaFunction::TypeMetaFunction
                ((TypeMetaFunction *)&pPVar4->item,&(t->super_Statement).super_ASTObject.context,t,
                 makeReference);
      pPVar4->destructor =
           PoolAllocator::
           allocate<soul::AST::TypeMetaFunction,_soul::AST::Context_&,_soul::AST::Expression_&,_soul::AST::TypeMetaFunction::Op>
           ::anon_class_1_0_00000001::__invoke;
      return (Expression *)&pPVar4->item;
    case eventType:
      CompileMessageHelpers::createMessage<>
                (&local_60,syntax,error,"Event types cannot be references");
      (*(this->super_SOULTokeniser)._vptr_Tokeniser[2])(this,&local_60);
      RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_60.location.sourceCode.object);
      break;
    case structMember:
      CompileMessageHelpers::createMessage<>
                (&local_60,syntax,error,"Struct members cannot be references");
      (*(this->super_SOULTokeniser)._vptr_Tokeniser[2])(this,&local_60);
      RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_60.location.sourceCode.object);
      break;
    case usingDeclTarget:
      CompileMessageHelpers::createMessage<>
                (&local_60,syntax,error,"Using declarations cannot be references");
      (*(this->super_SOULTokeniser)._vptr_Tokeniser[2])(this,&local_60);
      RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_60.location.sourceCode.object);
      break;
    case processorParameter:
      CompileMessageHelpers::createMessage<>
                (&local_60,syntax,error,"Processor parameter types cannot be references");
      (*(this->super_SOULTokeniser)._vptr_Tokeniser[2])(this,&local_60);
      RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_60.location.sourceCode.object);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60.description._M_dataplus._M_p != &local_60.description.field_2) {
      operator_delete(local_60.description._M_dataplus._M_p,
                      local_60.description.field_2._M_allocated_capacity + 1);
    }
  }
switchD_001fa30e_caseD_1:
  pcVar1 = (this->super_SOULTokeniser).currentType.text;
  if ((pcVar1 == ".") || ((pcVar1 != (char *)0x0 && (iVar3 = strcmp(pcVar1,"."), iVar3 == 0)))) {
    t = parseDotOperator(this,t);
  }
  return t;
}

Assistant:

AST::Expression& parseArrayTypeSuffixes (AST::Expression& t, ParseTypeContext parseContext)
    {
        if (matchIf (Operator::openBracket))
            return parseArrayTypeSuffixes (parseSubscriptWithBrackets (t), parseContext);

        if (matches (Operator::bitwiseAnd))
        {
            switch (parseContext)
            {
                case ParseTypeContext::variableType:         throwError (Errors::typeCannotBeReference()); break;
                case ParseTypeContext::eventType:            throwError (Errors::eventTypeCannotBeReference()); break;
                case ParseTypeContext::structMember:         throwError (Errors::memberCannotBeReference()); break;
                case ParseTypeContext::usingDeclTarget:      throwError (Errors::usingCannotBeReference()); break;
                case ParseTypeContext::processorParameter:   throwError (Errors::processorParamsCannotBeReference()); break;
                case ParseTypeContext::metaFunctionArgument: break;
                case ParseTypeContext::nameOrType:           break;

                default:
                    skip();
                    return allocate<AST::TypeMetaFunction> (t.context, t, AST::TypeMetaFunction::Op::makeReference);
            }
        }

        if (matches (Operator::dot))
            return parseDotOperator (t);

        return t;
    }